

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_im2col(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t iih;
  ulong uVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  int iVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined2 uVar29;
  long lVar30;
  int64_t ikw;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_118;
  void *local_108;
  long local_100;
  void *local_f8;
  long local_f0;
  long local_e0;
  
  if (dst->type == GGML_TYPE_F32) {
    pgVar6 = dst->src[1];
    if (pgVar6->type == GGML_TYPE_F32) {
      uVar11 = 1;
      uVar25 = dst->ne[2];
      uVar12 = pgVar6->ne[1];
      uVar10 = pgVar6->ne[2];
      if (dst->op_params[6] != 1) {
        uVar25 = uVar11;
        uVar12 = uVar11;
        uVar10 = pgVar6->ne[1];
      }
      if (pgVar6->nb[0] == 4) {
        lVar35 = (long)params->nth;
        bVar40 = dst->op_params[6] == 1;
        iVar34 = (int)pgVar6->nb[2];
        uVar31 = dst->ne[1];
        lVar32 = (long)params->ith;
        iVar37 = dst->op_params[2];
        lVar8 = pgVar6->ne[0];
        uVar16 = pgVar6->ne[2];
        if (bVar40) {
          uVar16 = pgVar6->ne[3];
        }
        iVar1 = dst->op_params[5];
        uVar9 = dst->src[0]->ne[0];
        if (bVar40) {
          uVar11 = dst->src[0]->ne[1];
        }
        iVar19 = (int)pgVar6->nb[1];
        if (bVar40) {
          iVar19 = iVar34;
        }
        iVar2 = dst->op_params[3];
        if (bVar40) {
          iVar34 = (int)pgVar6->nb[3];
        }
        lVar39 = uVar11 * uVar9;
        local_130 = (void *)(lVar32 * iVar19 + lVar8 * iVar2 * -4 + (long)iVar37 * -4);
        iVar3 = dst->op_params[4];
        iVar4 = dst->op_params[0];
        local_118 = (void *)(lVar39 * lVar32 * 4 + (long)dst->data);
        iVar5 = dst->op_params[1];
        lVar38 = uVar31 * lVar39 * uVar10;
        for (uVar22 = 0; uVar22 != (~((long)uVar16 >> 0x3f) & uVar16); uVar22 = uVar22 + 1) {
          local_100 = (long)local_130;
          local_140 = local_118;
          for (uVar27 = 0; uVar27 != (~((long)uVar25 >> 0x3f) & uVar25); uVar27 = uVar27 + 1) {
            local_f0 = local_100;
            local_138 = local_140;
            lVar36 = -(long)iVar37;
            for (uVar21 = 0; lVar15 = local_f0, pvVar13 = local_138, lVar26 = lVar32,
                uVar21 != (~((long)uVar31 >> 0x3f) & uVar31); uVar21 = uVar21 + 1) {
              for (; lVar26 < (long)uVar10; lVar26 = lVar26 + lVar35) {
                lVar14 = (long)pgVar6->data + lVar15;
                pvVar23 = pvVar13;
                for (uVar24 = 0; uVar24 != (~((long)uVar11 >> 0x3f) & uVar11); uVar24 = uVar24 + 1)
                {
                  lVar17 = 0;
                  lVar30 = uVar24 * (long)iVar1 + (uVar27 * (long)iVar5 - (long)iVar2);
                  for (uVar33 = 0; (~((long)uVar9 >> 0x3f) & uVar9) != uVar33; uVar33 = uVar33 + 1)
                  {
                    uVar41 = 0;
                    if ((((-1 < lVar30) && (lVar30 < (long)uVar12)) && (-1 < lVar36 + lVar17)) &&
                       (lVar36 + lVar17 < lVar8)) {
                      uVar41 = *(undefined4 *)(lVar14 + lVar17 * 4);
                    }
                    *(undefined4 *)((long)pvVar23 + uVar33 * 4) = uVar41;
                    lVar17 = lVar17 + iVar3;
                  }
                  pvVar23 = (void *)((long)pvVar23 + uVar9 * 4);
                  lVar14 = lVar14 + lVar8 * iVar1 * 4;
                }
                lVar15 = lVar15 + iVar19 * lVar35;
                pvVar13 = (void *)((long)pvVar13 + lVar39 * lVar35 * 4);
              }
              lVar36 = lVar36 + iVar4;
              local_138 = (void *)((long)local_138 + lVar39 * uVar10 * 4);
              local_f0 = local_f0 + (long)iVar4 * 4;
            }
            local_100 = local_100 + lVar8 * iVar5 * 4;
            local_140 = (void *)((long)local_140 + lVar38 * 4);
          }
          local_118 = (void *)((long)local_118 + uVar25 * lVar38 * 4);
          local_130 = (void *)((long)local_130 + (long)iVar34);
        }
        return;
      }
      pcVar18 = "nb10 == sizeof(float)";
      uVar28 = 0x1671;
    }
    else {
      pcVar18 = "src1->type == GGML_TYPE_F32";
      uVar28 = 0x1653;
    }
  }
  else {
    if (dst->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                 ,0x16ef,"fatal error");
    }
    pgVar6 = dst->src[0];
    if (pgVar6->type == GGML_TYPE_F16) {
      pgVar7 = dst->src[1];
      if (pgVar7->type == GGML_TYPE_F32) {
        bVar40 = dst->op_params[6] != 1;
        iVar37 = (int)pgVar7->nb[2];
        uVar11 = pgVar7->ne[2];
        uVar25 = pgVar7->ne[3];
        if (bVar40) {
          uVar11 = pgVar7->ne[1];
          uVar25 = pgVar7->ne[2];
        }
        uVar12 = 1;
        uVar31 = pgVar6->ne[1];
        uVar10 = pgVar7->ne[1];
        if (bVar40) {
          uVar31 = uVar12;
          uVar10 = uVar12;
        }
        if (!bVar40) {
          uVar12 = dst->ne[2];
        }
        iVar34 = (int)pgVar7->nb[3];
        if (bVar40) {
          iVar34 = iVar37;
        }
        if (bVar40) {
          iVar37 = (int)pgVar7->nb[1];
        }
        if (pgVar6->nb[0] == 2) {
          if (pgVar7->nb[0] == 4) {
            iVar1 = dst->op_params[0];
            iVar19 = dst->op_params[3];
            lVar8 = pgVar7->ne[0];
            lVar39 = (long)params->ith;
            uVar16 = pgVar6->ne[0];
            uVar9 = dst->ne[1];
            iVar2 = dst->op_params[2];
            lVar35 = (long)params->nth;
            iVar3 = dst->op_params[5];
            iVar4 = dst->op_params[4];
            lVar32 = uVar31 * uVar16;
            local_e0 = lVar39 * iVar37 + lVar8 * iVar19 * -4 + (long)iVar2 * -4;
            iVar5 = dst->op_params[1];
            local_130 = (void *)(lVar32 * lVar39 * 2 + (long)dst->data);
            lVar38 = uVar9 * lVar32 * uVar11;
            for (uVar22 = 0; uVar22 != (~((long)uVar25 >> 0x3f) & uVar25); uVar22 = uVar22 + 1) {
              local_140 = (void *)local_e0;
              local_108 = local_130;
              for (uVar27 = 0; uVar27 != (~((long)uVar12 >> 0x3f) & uVar12); uVar27 = uVar27 + 1) {
                local_138 = local_140;
                local_f8 = local_108;
                lVar36 = -(long)iVar2;
                for (uVar21 = 0; pvVar13 = local_138, pvVar23 = local_f8, lVar15 = lVar39,
                    uVar21 != (~((long)uVar9 >> 0x3f) & uVar9); uVar21 = uVar21 + 1) {
                  for (; lVar15 < (long)uVar11; lVar15 = lVar15 + lVar35) {
                    lVar26 = (long)pgVar7->data + (long)pvVar13;
                    pvVar20 = pvVar23;
                    for (uVar24 = 0; uVar24 != (~((long)uVar31 >> 0x3f) & uVar31);
                        uVar24 = uVar24 + 1) {
                      lVar30 = 0;
                      lVar14 = uVar24 * (long)iVar3 + (uVar27 * (long)iVar5 - (long)iVar19);
                      for (uVar33 = 0; (~((long)uVar16 >> 0x3f) & uVar16) != uVar33;
                          uVar33 = uVar33 + 1) {
                        uVar29 = 0;
                        if (((-1 < lVar14) && (lVar14 < (long)uVar10)) &&
                           ((-1 < lVar36 + lVar30 && (uVar29 = 0, lVar36 + lVar30 < lVar8)))) {
                          auVar42 = vcvtps2ph_f16c(ZEXT416(*(uint *)(lVar26 + lVar30 * 4)),0);
                          uVar29 = auVar42._0_2_;
                        }
                        *(undefined2 *)((long)pvVar20 + uVar33 * 2) = uVar29;
                        lVar30 = lVar30 + iVar4;
                      }
                      pvVar20 = (void *)((long)pvVar20 + uVar16 * 2);
                      lVar26 = lVar26 + lVar8 * iVar3 * 4;
                    }
                    pvVar13 = (void *)((long)pvVar13 + iVar37 * lVar35);
                    pvVar23 = (void *)((long)pvVar23 + lVar32 * lVar35 * 2);
                  }
                  lVar36 = lVar36 + iVar1;
                  local_f8 = (void *)((long)local_f8 + lVar32 * uVar11 * 2);
                  local_138 = (void *)((long)local_138 + (long)iVar1 * 4);
                }
                local_140 = (void *)((long)local_140 + lVar8 * iVar5 * 4);
                local_108 = (void *)((long)local_108 + lVar38 * 2);
              }
              local_130 = (void *)((long)local_130 + uVar12 * lVar38 * 2);
              local_e0 = local_e0 + iVar34;
            }
            return;
          }
          pcVar18 = "nb10 == sizeof(float)";
          uVar28 = 0x16bf;
        }
        else {
          pcVar18 = "nb00 == sizeof(ggml_fp16_t)";
          uVar28 = 0x16be;
        }
      }
      else {
        pcVar18 = "src1->type == GGML_TYPE_F32";
        uVar28 = 0x16a0;
      }
    }
    else {
      pcVar18 = "src0->type == GGML_TYPE_F16";
      uVar28 = 0x169f;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar28,"GGML_ASSERT(%s) failed",pcVar18);
}

Assistant:

void ggml_compute_forward_im2col(
        const ggml_compute_params * params,
              ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_im2col_f16(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_im2col_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}